

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_init(nk_draw_list *list)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  nk_draw_list *__s;
  float fVar4;
  
  if (list != (nk_draw_list *)0x0) {
    uVar2 = (ulong)list & 3;
    if (uVar2 == 0) {
      uVar3 = 0xf0;
      __s = list;
    }
    else {
      memset(list,0,4 - uVar2);
      uVar3 = uVar2 | 0xec;
      __s = (nk_draw_list *)((4 - uVar2) + (long)list);
    }
    uVar2 = (ulong)((uint)uVar3 & 0xfffffffc);
    memset(__s,0,uVar2);
    if ((uVar3 & 3) != 0) {
      memset((void *)((long)&(((nk_draw_list *)(__s->circle_vtx + -2))->clip_rect).x + uVar2),0,
             uVar3 & 3);
    }
    lVar1 = 0;
    do {
      fVar4 = ((float)lVar1 / 12.0 + (float)lVar1 / 12.0) * 3.1415927;
      list->circle_vtx[lVar1].x =
           ((((((fVar4 * -5.2302214e-14 + 0.000990141) * fVar4 + -0.018663716) * fVar4 + 0.1071238)
              * fVar4 + -0.11813404) * fVar4 + -0.39438233) * fVar4 + -0.038191997) * fVar4 +
           1.002386;
      list->circle_vtx[lVar1].y =
           ((((((fVar4 * 0.00013823564 + -0.0030399605) * fVar4 + 0.02080266) * fVar4 + -0.02673534)
              * fVar4 + -0.13807878) * fVar4 + -0.012127613) * fVar4 + 1.0008676) * fVar4 +
           1.910593e-31;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xc);
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x23b1,"void nk_draw_list_init(struct nk_draw_list *)");
}

Assistant:

NK_API void
nk_draw_list_init(struct nk_draw_list *list)
{
    nk_size i = 0;
    NK_ASSERT(list);
    if (!list) return;
    nk_zero(list, sizeof(*list));
    for (i = 0; i < NK_LEN(list->circle_vtx); ++i) {
        const float a = ((float)i / (float)NK_LEN(list->circle_vtx)) * 2 * NK_PI;
        list->circle_vtx[i].x = (float)NK_COS(a);
        list->circle_vtx[i].y = (float)NK_SIN(a);
    }
}